

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sign.c
# Opt level: O1

int main(int argc,char **argv)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int extraout_EAX;
  EVP_PKEY_CTX *pEVar8;
  BIO_METHOD *type;
  BIO *bp;
  EVP_PKEY *pEVar9;
  long lVar10;
  long lVar11;
  EC_KEY *key;
  EC_GROUP *group;
  uchar *puVar12;
  uchar *puVar13;
  uchar *sig;
  byte bVar14;
  char *pcVar15;
  test_sign *ptVar16;
  char *pcVar17;
  bool bVar18;
  EVP_PKEY *pkey;
  EVP_PKEY *priv_key;
  EVP_PKEY *key2;
  uchar *kptr;
  uchar *tptr;
  bool local_89;
  EVP_PKEY *local_88;
  EVP_PKEY *local_80;
  byte local_76;
  byte local_75;
  byte local_74;
  byte local_73;
  byte local_72;
  byte local_71;
  uchar *local_70;
  size_t local_68;
  EVP_PKEY *local_60;
  ulong local_58;
  test_sign *local_50;
  uchar *local_48;
  uint local_3c;
  uchar *local_38;
  
  OPENSSL_init_crypto(0x4c,0);
  ptVar16 = test_signs;
  pcVar15 = "NID_id_GostR3410_2001_CryptoPro_A_ParamSet";
  pcVar17 = (char *)0x0;
  while( true ) {
    uVar1 = ptVar16->bits;
    printf("\x1b[1;34mTest %s:\x1b[m\n",pcVar15);
    if (uVar1 == 0x100) break;
    uVar7 = 0xffffffff;
    if (uVar1 == 0x200) {
      iVar3 = 0x3d4;
      pcVar15 = "gost2012_512";
      goto LAB_00102532;
    }
LAB_00102e44:
    uVar7 = (uint)pcVar17 | uVar7;
    pcVar17 = (char *)(ulong)uVar7;
    pcVar15 = ptVar16[1].name;
    ptVar16 = ptVar16 + 1;
    if (pcVar15 == (char *)0x0) {
      pcVar15 = "\x1b[0;31m= Some tests FAILED!\x1b[m";
      if (uVar7 == 0) {
        pcVar15 = "\x1b[0;32m= All tests passed!\x1b[m";
      }
      puts(pcVar15);
      return uVar7;
    }
  }
  iVar3 = 0x3d3;
  pcVar15 = "gost2012_256";
LAB_00102532:
  local_88 = EVP_PKEY_new();
  if (local_88 == (EVP_PKEY *)0x0) {
LAB_00102ee3:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("pkey = EVP_PKEY_new()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0x83);
LAB_00102f0a:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("ctx = EVP_PKEY_CTX_new(pkey, NULL)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0x86);
LAB_00102f31:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("EVP_PKEY_keygen_init(ctx)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0x87);
LAB_00102f58:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("EVP_PKEY_CTX_ctrl(ctx, type, -1, EVP_PKEY_CTRL_GOST_PARAMSET, t->nid, NULL)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0x88);
LAB_00102f7f:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("bp = BIO_new(BIO_s_secmem())",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0x94);
LAB_00102fa6:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("d2i_PrivateKey_bio(bp, &pkey)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0xa2);
LAB_00102fcd:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("i2d_PrivateKey_bio(bp, priv_key)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0xb7);
LAB_00102ff4:
    ERR_print_errors_fp(*(FILE **)pcVar17);
    OPENSSL_die("d2i_PrivateKey(type, &pkey, &tptr, klen)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0xd9);
LAB_00103015:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("EVP_PKEY_CTX_ctrl_str(ctx1, \"paramset\", t->paramset)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0xe8);
LAB_0010303c:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("sig2 = OPENSSL_malloc(siglen)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0x123);
LAB_00103063:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("i2d_PrivateKey_bio(bp, priv_key)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0xa1);
LAB_0010308a:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("BIO_reset(bp)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0xb6);
LAB_001030b1:
    ERR_print_errors_fp(*(FILE **)pcVar17);
    OPENSSL_die("klen = i2d_PrivateKey(priv_key, &kptr)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0xd6);
LAB_001030d2:
    ERR_print_errors_fp(*(FILE **)pcVar17);
    OPENSSL_die("EVP_PKEY_keygen_init(ctx1)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0xe7);
LAB_001030f3:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("EVP_PKEY_sign_init(ctx)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0x119);
LAB_0010311a:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("BIO_reset(bp)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0xa0);
LAB_00103141:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("d2i_PrivateKey_ex_bio(bp, &pkey, NULL, NULL)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0xad);
LAB_00103168:
    ERR_print_errors_fp(*(FILE **)pcVar17);
    OPENSSL_die("ctx1 = EVP_PKEY_CTX_new(key1, NULL)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0xe6);
LAB_00103189:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("ctx = EVP_PKEY_CTX_new(priv_key, NULL)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0x116);
LAB_001031b0:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("PEM_read_bio_PrivateKey(bp, &pkey, NULL, NULL)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0x97);
LAB_001031d7:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("i2d_PrivateKey_bio(bp, priv_key)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0xac);
LAB_001031fe:
    ERR_print_errors_fp(*(FILE **)pcVar17);
    OPENSSL_die("EVP_PKEY_set_type_str(key1, algname, strlen(algname))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0xe4);
LAB_0010321f:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("hash = OPENSSL_zalloc(len)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0x115);
LAB_00103246:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("PEM_write_bio_PrivateKey(bp, priv_key, NULL, NULL, 0, NULL, NULL)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0x95);
LAB_0010326d:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("BIO_reset(bp)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0xab);
LAB_00103294:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("cts = OSSL_STORE_attach(bp, \"file\", NULL, NULL, NULL, NULL, NULL, NULL, NULL)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0xbc);
LAB_001032bb:
    ERR_print_errors_fp(*(FILE **)pcVar17);
    OPENSSL_die("key1 = EVP_PKEY_new()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0xe3);
LAB_001032dc:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("sig = OPENSSL_malloc(siglen)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0x113);
  }
  else {
    iVar2 = EVP_PKEY_set_type(local_88,iVar3);
    if (iVar2 == 0) {
      main_cold_2();
      uVar7 = 0xffffffff;
      goto LAB_00102e44;
    }
    pEVar8 = EVP_PKEY_CTX_new(local_88,(ENGINE *)0x0);
    if (pEVar8 == (EVP_PKEY_CTX *)0x0) goto LAB_00102f0a;
    iVar2 = EVP_PKEY_keygen_init(pEVar8);
    if (iVar2 == 0) goto LAB_00102f31;
    local_70 = (uchar *)CONCAT44(local_70._4_4_,iVar3);
    local_58 = uVar1;
    iVar3 = EVP_PKEY_CTX_ctrl(pEVar8,iVar3,-1,0x1001,ptVar16->nid,(void *)0x0);
    if (iVar3 == 0) goto LAB_00102f58;
    local_80 = (EVP_PKEY *)0x0;
    iVar3 = EVP_PKEY_keygen(pEVar8,&local_80);
    printf("\tEVP_PKEY_keygen:\t");
    print_test_result(iVar3);
    EVP_PKEY_CTX_free(pEVar8);
    EVP_PKEY_free(local_88);
    uVar7 = 0xffffffff;
    if (iVar3 != 1) goto LAB_00102e44;
    local_50 = ptVar16;
    type = (BIO_METHOD *)BIO_s_secmem();
    bp = BIO_new(type);
    if (bp == (BIO *)0x0) goto LAB_00102f7f;
    iVar3 = PEM_write_bio_PrivateKey
                      (bp,local_80,(EVP_CIPHER *)0x0,(uchar *)0x0,0,(undefined1 *)0x0,(void *)0x0);
    if (iVar3 == 0) goto LAB_00103246;
    local_88 = (EVP_PKEY *)0x0;
    pEVar9 = PEM_read_bio_PrivateKey(bp,&local_88,(undefined1 *)0x0,(void *)0x0);
    if (pEVar9 == (EVP_PKEY *)0x0) goto LAB_001031b0;
    printf("\tPEM_read_bio_PrivateKey:");
    iVar3 = EVP_PKEY_cmp(local_80,local_88);
    print_test_result((uint)(iVar3 != 0));
    EVP_PKEY_free(local_88);
    lVar10 = BIO_ctrl(bp,1,0,(void *)0x0);
    if ((int)lVar10 == 0) goto LAB_0010311a;
    iVar2 = i2d_PrivateKey_bio(bp,local_80);
    if (iVar2 == 0) goto LAB_00103063;
    local_3c = (uint)pcVar17;
    pEVar9 = d2i_PrivateKey_bio(bp,&local_88);
    if (pEVar9 == (EVP_PKEY *)0x0) goto LAB_00102fa6;
    printf("\td2i_PrivateKey_bio:\t");
    iVar2 = EVP_PKEY_cmp(local_80,local_88);
    bVar18 = iVar2 != 0;
    pcVar17 = (char *)(ulong)bVar18;
    print_test_result((uint)bVar18);
    EVP_PKEY_free(local_88);
    lVar10 = BIO_ctrl(bp,1,0,(void *)0x0);
    if ((int)lVar10 == 0) goto LAB_0010326d;
    iVar2 = i2d_PrivateKey_bio(bp,local_80);
    if (iVar2 == 0) goto LAB_001031d7;
    lVar10 = d2i_PrivateKey_ex_bio(bp,&local_88,0);
    if (lVar10 == 0) goto LAB_00103141;
    printf("\td2i_PrivateKey_ex_bio:\t");
    iVar2 = EVP_PKEY_cmp(local_80,local_88);
    print_test_result((uint)(iVar2 != 0));
    EVP_PKEY_free(local_88);
    lVar10 = BIO_ctrl(bp,1,0,(void *)0x0);
    if ((int)lVar10 == 0) goto LAB_0010308a;
    iVar4 = i2d_PrivateKey_bio(bp,local_80);
    if (iVar4 == 0) goto LAB_00102fcd;
    printf("\tOSSL_STORE_attach:\t");
    fflush(_stdout);
    local_88 = (EVP_PKEY *)0x0;
    lVar10 = OSSL_STORE_attach(bp,"file",0,0,0,0,0,0,0);
    if (lVar10 == 0) goto LAB_00103294;
    local_58 = local_58 >> 3;
    local_89 = (iVar3 == 0 || !bVar18) || iVar2 == 0;
    pcVar17 = &stderr;
    do {
      lVar11 = OSSL_STORE_load(lVar10);
      if (lVar11 == 0) {
        ERR_print_errors_fp(_stderr);
        iVar3 = OSSL_STORE_eof(lVar10);
        if (iVar3 == 0) {
          ERR_print_errors_fp(_stderr);
          OPENSSL_die("OSSL_STORE_eof(cts)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                      ,0xc1);
LAB_00102ec2:
          ERR_print_errors_fp(_stderr);
          OPENSSL_die("(pkey = OSSL_STORE_INFO_get1_PKEY(info))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                      ,0xc5);
          goto LAB_00102ee3;
        }
      }
      else {
        iVar3 = OSSL_STORE_INFO_get_type(lVar11);
        if (iVar3 == 4) {
          local_88 = (EVP_PKEY *)OSSL_STORE_INFO_get1_PKEY(lVar11);
          if (local_88 == (EVP_PKEY *)0x0) goto LAB_00102ec2;
        }
        OSSL_STORE_INFO_free(lVar11);
      }
    } while (lVar11 != 0);
    OSSL_STORE_close(lVar10);
    if (local_88 == (EVP_PKEY *)0x0) {
      puts("\x1b[1;36mskipped\x1b[m");
    }
    else {
      iVar3 = EVP_PKEY_cmp(local_80,local_88);
      print_test_result((uint)(iVar3 != 0));
      local_89 = local_89 || iVar3 == 0;
      EVP_PKEY_free(local_88);
    }
    BIO_free(bp);
    local_48 = (uchar *)0x0;
    iVar3 = i2d_PrivateKey(local_80,&local_48);
    if (iVar3 == 0) goto LAB_001030b1;
    local_38 = local_48;
    local_88 = (EVP_PKEY *)0x0;
    pEVar9 = d2i_PrivateKey((uint)local_70,&local_88,&local_38,(long)iVar3);
    if (pEVar9 == (EVP_PKEY *)0x0) goto LAB_00102ff4;
    printf("\td2i_PrivateKey:\t\t");
    iVar3 = EVP_PKEY_cmp(local_80,local_88);
    print_test_result((uint)(iVar3 != 0));
    EVP_PKEY_free(local_88);
    CRYPTO_free(local_48);
    pEVar9 = EVP_PKEY_new();
    if (pEVar9 == (EVP_PKEY *)0x0) goto LAB_001032bb;
    iVar2 = EVP_PKEY_set_type_str(pEVar9,pcVar15,0xc);
    puVar12 = local_70;
    uVar7 = (uint)local_70;
    if (iVar2 == 0) goto LAB_001031fe;
    pEVar8 = EVP_PKEY_CTX_new(pEVar9,(ENGINE *)0x0);
    if (pEVar8 == (EVP_PKEY_CTX *)0x0) goto LAB_00103168;
    iVar2 = EVP_PKEY_keygen_init(pEVar8);
    if (iVar2 == 0) goto LAB_001030d2;
    iVar2 = EVP_PKEY_CTX_ctrl_str(pEVar8,"paramset",local_50->paramset);
    if (iVar2 == 0) goto LAB_00103015;
    local_60 = (EVP_PKEY *)0x0;
    iVar2 = EVP_PKEY_keygen(pEVar8,&local_60);
    printf("\tEVP_PKEY_*_str:\t\t");
    print_test_result(iVar2);
    local_71 = iVar2 == 0;
    uVar5 = EVP_PKEY_get_id(local_60);
    printf("\tEVP_PKEY_id (%d):\t",(ulong)puVar12 & 0xffffffff);
    if (uVar5 == uVar7) {
      printf("\x1b[1;32m%s\x1b[m\n","match");
    }
    else {
      printf("\x1b[1;31m%s [%d]\x1b[m\n","mismatch",(ulong)uVar5);
    }
    key = (EC_KEY *)EVP_PKEY_get0(local_60);
    group = EC_KEY_get0_group(key);
    uVar6 = EC_GROUP_get_curve_name(group);
    uVar7 = local_50->nid;
    printf("\tcurve_name (%d):\t",(ulong)uVar7);
    if (uVar6 == uVar7) {
      printf("\x1b[1;32m%s\x1b[m\n","match");
    }
    else {
      printf("\x1b[1;31m%s [%d]\x1b[m\n","mismatch",(ulong)uVar6);
    }
    local_72 = uVar5 != (uint)local_70 || uVar6 != uVar7;
    uVar7 = EVP_PKEY_cmp_parameters(local_80,local_60);
    printf("\tEVP_PKEY_cmp_parameters:");
    if (uVar7 == 1) {
      printf("\x1b[1;32m%s\x1b[m\n","success");
    }
    else {
      printf("\x1b[1;31m%s [%d]\x1b[m\n","failure",(ulong)uVar7);
    }
    pcVar17 = "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c";
    local_73 = uVar7 != 1;
    uVar5 = EVP_PKEY_cmp(local_80,local_60);
    printf("\tEVP_PKEY_cmp:\t\t");
    uVar7 = (uint)(uVar5 == 0);
    if ((int)uVar5 < 0) {
      uVar7 = uVar5;
    }
    if (uVar5 == 0) {
      printf("\x1b[1;32m%s\x1b[m\n","differ (good)");
    }
    else {
      printf("\x1b[1;31m%s [%d]\x1b[m\n","equal (error)",(ulong)uVar7);
    }
    EVP_PKEY_CTX_free(pEVar8);
    EVP_PKEY_free(pEVar9);
    iVar2 = EVP_PKEY_get_size(local_80);
    local_68 = (size_t)iVar2;
    puVar12 = (uchar *)CRYPTO_malloc(iVar2,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                                     ,0x113);
    if (puVar12 == (uchar *)0x0) goto LAB_001032dc;
    puVar13 = (uchar *)CRYPTO_zalloc(local_58,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                                     ,0x115);
    if (puVar13 == (uchar *)0x0) goto LAB_0010321f;
    pEVar8 = EVP_PKEY_CTX_new(local_80,(ENGINE *)0x0);
    if (pEVar8 == (EVP_PKEY_CTX *)0x0) goto LAB_00103189;
    local_75 = uVar7 != 1;
    local_74 = iVar3 == 0;
    local_70 = puVar13;
    iVar3 = EVP_PKEY_sign_init(pEVar8);
    uVar1 = local_58;
    puVar13 = local_70;
    if (iVar3 == 0) goto LAB_001030f3;
    iVar3 = EVP_PKEY_sign(pEVar8,puVar12,&local_68,local_70,local_58);
    printf("\tEVP_PKEY_sign:\t\t");
    print_test_result(iVar3);
    local_76 = iVar3 != 1;
    sig = (uchar *)CRYPTO_malloc((int)local_68,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                                 ,0x123);
    if (sig == (uchar *)0x0) goto LAB_0010303c;
    iVar3 = EVP_PKEY_sign(pEVar8,sig,&local_68,puVar13,uVar1);
    if (iVar3 != 1) {
      main_cold_1();
      uVar7 = 0xffffffff;
LAB_00102e3a:
      pcVar17 = (char *)(ulong)local_3c;
      ptVar16 = local_50;
      goto LAB_00102e44;
    }
    printf("\tNon-determinism:\t");
    iVar3 = bcmp(puVar12,sig,local_68);
    print_test_result((uint)(iVar3 != 0));
    CRYPTO_free(sig);
    iVar2 = EVP_PKEY_verify_init(pEVar8);
    uVar1 = local_58;
    puVar13 = local_70;
    if (iVar2 == 0) goto LAB_0010332a;
    *local_70 = *local_70 + '\x01';
    iVar2 = EVP_PKEY_verify(pEVar8,puVar12,local_68,local_70,local_58);
    printf("\tEVP_PKEY_verify:\t");
    print_test_result(iVar2);
    iVar4 = EVP_PKEY_verify_init(pEVar8);
    if (iVar4 != 0) {
      bVar14 = local_89 | local_74 | local_71 | local_72 | local_73 | local_75 | local_76;
      *puVar13 = *puVar13 + '\x01';
      uVar5 = EVP_PKEY_verify(pEVar8,puVar12,local_68,puVar13,uVar1);
      uVar7 = (uint)(uVar5 == 0);
      if ((int)uVar5 < 0) {
        uVar7 = uVar5;
      }
      printf("\tFalse positive test:\t");
      print_test_result(uVar7);
      uVar7 = (uint)(byte)(uVar7 != 1 | (iVar2 != 1 || iVar3 == 0) | bVar14);
      EVP_PKEY_CTX_free(pEVar8);
      CRYPTO_free(puVar12);
      CRYPTO_free(puVar13);
      EVP_PKEY_free(local_80);
      EVP_PKEY_free(local_60);
      goto LAB_00102e3a;
    }
  }
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_PKEY_verify_init(ctx)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c",
              0x134);
LAB_0010332a:
  ERR_print_errors_fp(_stderr);
  iVar3 = 0x1047dd;
  OPENSSL_die("EVP_PKEY_verify_init(ctx)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c",
              300);
  if (iVar3 == 0) {
    iVar3 = puts("\x1b[1;31mfailure\x1b[m");
    return iVar3;
  }
  if (iVar3 == 1) {
    iVar3 = puts("\x1b[1;32msuccess\x1b[m");
    return iVar3;
  }
  ERR_print_errors_fp(_stderr);
  return extraout_EAX;
}

Assistant:

int main(int argc, char **argv)
{
    int ret = 0;

    OPENSSL_add_all_algorithms_conf();

    struct test_sign *sp;
    for (sp = test_signs; sp->name; sp++)
	ret |= test_sign(sp);

    if (ret)
	printf(cDRED "= Some tests FAILED!" cNORM "\n");
    else
	printf(cDGREEN "= All tests passed!" cNORM "\n");
    return ret;
}